

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_finished(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  uint8_t *puVar1;
  size_t rec_start;
  uint8_t *puVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  st_ptls_key_schedule_t *psVar8;
  long lVar9;
  ptls_hash_context_t **pppVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  
  rec_start = sendbuf->off;
  iVar5 = ptls_buffer_reserve(sendbuf,3);
  if (iVar5 != 0) {
    return iVar5;
  }
  puVar2 = sendbuf->base;
  sVar3 = sendbuf->off;
  puVar1 = puVar2 + sVar3;
  puVar1[0] = '\x16';
  puVar1[1] = '\x03';
  puVar2[sVar3 + 2] = '\x03';
  sendbuf->off = sendbuf->off + 3;
  iVar5 = ptls_buffer_reserve(sendbuf,2);
  if (iVar5 == 0) {
    puVar1 = sendbuf->base;
    sVar3 = sendbuf->off;
    (puVar1 + sVar3)[0] = '\0';
    (puVar1 + sVar3)[1] = '\0';
    sVar11 = sendbuf->off;
    sVar3 = sVar11 + 2;
    sendbuf->off = sVar3;
    uVar6 = ptls_buffer_reserve(sendbuf,1);
    psVar8 = (st_ptls_key_schedule_t *)(ulong)uVar6;
    bVar4 = true;
    if (uVar6 == 0) {
      sendbuf->base[sendbuf->off] = '\x14';
      sendbuf->off = sendbuf->off + 1;
      iVar5 = ptls_buffer_reserve(sendbuf,3);
      bVar4 = true;
      if (iVar5 == 0) {
        puVar1 = sendbuf->base;
        sVar12 = sendbuf->off;
        puVar1[sVar12 + 2] = '\0';
        puVar1 = puVar1 + sVar12;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        sVar12 = sendbuf->off;
        sendbuf->off = sVar12 + 3;
        iVar5 = ptls_buffer_reserve(sendbuf,(tls->key_schedule->hashes[0].algo)->digest_size);
        if ((iVar5 == 0) &&
           (iVar5 = calc_verify_data(sendbuf->base + sendbuf->off,tls->key_schedule,
                                     &(tls->traffic_protection).enc), iVar5 == 0)) {
          sVar13 = sendbuf->off + (tls->key_schedule->hashes[0].algo)->digest_size;
          sendbuf->off = sVar13;
          uVar7 = sVar13 - (sVar12 + 3);
          lVar9 = 0x10;
          do {
            sendbuf->base[sVar12] = (uint8_t)(uVar7 >> ((byte)lVar9 & 0x3f));
            lVar9 = lVar9 + -8;
            sVar12 = sVar12 + 1;
          } while (lVar9 != -8);
          bVar4 = false;
          psVar8 = (st_ptls_key_schedule_t *)CONCAT71((int7)(uVar7 >> 8),1);
        }
        else {
          psVar8 = (st_ptls_key_schedule_t *)0x0;
          bVar4 = true;
        }
      }
      else {
        psVar8 = (st_ptls_key_schedule_t *)0x0;
      }
      if ((char)psVar8 != '\0') {
        psVar8 = tls->key_schedule;
        bVar4 = false;
        if ((psVar8 != (st_ptls_key_schedule_t *)0x0) && (psVar8->num_hashes != 0)) {
          puVar1 = sendbuf->base;
          sVar12 = sendbuf->off;
          pppVar10 = &psVar8->hashes[0].ctx;
          sVar13 = 0;
          do {
            (*(*pppVar10)->update)(*pppVar10,puVar1 + sVar3,sVar12 - sVar3);
            sVar13 = sVar13 + 1;
            pppVar10 = pppVar10 + 2;
          } while (sVar13 != psVar8->num_hashes);
          bVar4 = false;
        }
      }
    }
    if (bVar4) {
      return (int)psVar8;
    }
    sVar12 = sendbuf->off;
    lVar9 = 8;
    do {
      sendbuf->base[sVar11] = (uint8_t)(sVar12 - sVar3 >> ((byte)lVar9 & 0x3f));
      lVar9 = lVar9 + -8;
      sVar11 = sVar11 + 1;
    } while (lVar9 != -8);
    iVar5 = buffer_encrypt_record(sendbuf,rec_start,&(tls->traffic_protection).enc);
    return iVar5;
  }
  return iVar5;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret;

    buffer_push_handshake(sendbuf, tls->key_schedule, &tls->traffic_protection.enc, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(sendbuf->base + sendbuf->off, tls->key_schedule, tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}